

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.h
# Opt level: O0

void __thiscall
bwtil::LZ77<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rewind
          (LZ77<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,FILE *__stream)

{
  this->last_perc = -1;
  this->alphabet_iterator = 1;
  this->global_position = 0;
  this->position = 0;
  if ((this->opt).mode == file_path) {
    FileReader::rewind(&this->fr,__stream);
  }
  return;
}

Assistant:

void rewind(){

		last_perc=-1;
		alphabet_iterator=1;//start from 1 if terminator char is present
		global_position=0;
		position=0;

		if(opt.mode==file_path){

			fr.rewind();

		}

	}